

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O0

void xmlBufEmpty(xmlBufPtr buf)

{
  size_t start_buf;
  xmlBufPtr buf_local;
  
  if (((buf != (xmlBufPtr)0x0) && (buf->error == 0)) && (buf->content != (xmlChar *)0x0)) {
    if ((buf->size != (ulong)buf->compat_size) && (buf->compat_size < 0x7fffffff)) {
      buf->size = (ulong)buf->compat_size;
    }
    if ((buf->use != (ulong)buf->compat_use) && (buf->compat_use < 0x7fffffff)) {
      buf->use = (ulong)buf->compat_use;
    }
    buf->use = 0;
    if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) {
      buf->content = "";
    }
    else if ((buf->alloc == XML_BUFFER_ALLOC_IO) && (buf->contentIO != (xmlChar *)0x0)) {
      buf->size = (size_t)(buf->content + (buf->size - (long)buf->contentIO));
      buf->content = buf->contentIO;
      *buf->content = '\0';
    }
    else {
      *buf->content = '\0';
    }
    if (buf->size < 0x7fffffff) {
      buf->compat_size = (uint)buf->size;
    }
    else {
      buf->compat_size = 0x7fffffff;
    }
    if (buf->use < 0x7fffffff) {
      buf->compat_use = (uint)buf->use;
    }
    else {
      buf->compat_use = 0x7fffffff;
    }
  }
  return;
}

Assistant:

void
xmlBufEmpty(xmlBufPtr buf) {
    if ((buf == NULL) || (buf->error != 0)) return;
    if (buf->content == NULL) return;
    CHECK_COMPAT(buf)
    buf->use = 0;
    if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) {
        buf->content = BAD_CAST "";
    } else if ((buf->alloc == XML_BUFFER_ALLOC_IO) &&
               (buf->contentIO != NULL)) {
        size_t start_buf = buf->content - buf->contentIO;

	buf->size += start_buf;
        buf->content = buf->contentIO;
        buf->content[0] = 0;
    } else {
        buf->content[0] = 0;
    }
    UPDATE_COMPAT(buf)
}